

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void anon_unknown.dwarf_19f42::printTimeZoneOffset(OstreamBuffer *out,int seconds)

{
  int iVar1;
  int in_ESI;
  int mins;
  int hours;
  int psecs;
  char sign;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_ESI < 1) {
    in_ESI = -in_ESI;
  }
  iVar1 = in_ESI / 0x3c + (in_ESI / 0xe10) * -0x3c;
  binlog::detail::OstreamBuffer::put
            ((OstreamBuffer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char)((uint)in_stack_ffffffffffffffbc >> 0x18));
  printTwoDigits((OstreamBuffer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
  if (99 < iVar1) {
    iVar1 = 0;
  }
  printTwoDigits((OstreamBuffer *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void printTimeZoneOffset(binlog::detail::OstreamBuffer& out, int seconds)
{
  const char sign = (seconds >= 0) ? '+' : '-';
  const int psecs = std::abs(seconds);
  const int hours = psecs / 3600;
  const int mins  = (psecs / 60) - 60 * hours;
  out.put(sign);
  printTwoDigits(out, hours < 100 ? hours : 0);
  printTwoDigits(out, mins < 100 ? mins : 0);
}